

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

vector sptk::swipe::zerov(int xSz)

{
  double *pdVar1;
  vector vVar2;
  
  pdVar1 = (double *)calloc(8,(long)xSz);
  vVar2._4_4_ = 0;
  vVar2.x = xSz;
  vVar2.v = pdVar1;
  return vVar2;
}

Assistant:

vector zerov(int xSz) {
    vector nw_vector;
    nw_vector.x = xSz;
#if 0
    nw_vector.v = calloc(sizeof(double), xSz);
#else
    nw_vector.v = (double*) calloc(sizeof(double), xSz);
#endif
    return(nw_vector);
}